

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2SparseBricks.cpp
# Opt level: O3

void idx2::PrintStatistics(brick_pool *Bp)

{
  idx2_file *piVar1;
  unsigned_long *puVar2;
  bucket_status *pbVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  i64 Count [16];
  long local_a8 [17];
  
  piVar1 = Bp->Idx2;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  lVar5 = (Bp->BrickTable).LogCapacity;
  lVar4 = 1L << ((byte)lVar5 & 0x3f);
  if (lVar5 == 0x3f) {
    lVar5 = -0x8000000000000000;
LAB_0019ad89:
    if (lVar5 != lVar4) {
      puVar2 = (Bp->BrickTable).Keys;
      pbVar3 = (Bp->BrickTable).Stats;
      do {
        local_a8[(uint)puVar2[lVar5] & 0xf] = local_a8[(uint)puVar2[lVar5] & 0xf] + 1;
        do {
          lVar7 = lVar5 + 1;
          lVar5 = lVar5 + 1;
        } while (pbVar3[lVar7] != Occupied);
      } while (lVar4 != lVar5);
    }
  }
  else {
    lVar5 = 0;
    lVar7 = 0;
    if (0 < lVar4) {
      lVar7 = lVar4;
    }
    do {
      if ((Bp->BrickTable).Stats[lVar5] == Occupied) goto LAB_0019ad89;
      lVar5 = lVar5 + 1;
    } while (lVar7 + 1 != lVar5);
  }
  if (piVar1->NLevels != '\0') {
    uVar6 = 0;
    do {
      if (uVar6 == 0x10) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                     );
      }
      printf("level %d: %lld out of %lld bricks significant (%f percent)\n",uVar6 & 0xffffffff);
      uVar6 = uVar6 + 1;
    } while (uVar6 != (byte)piVar1->NLevels);
  }
  return;
}

Assistant:

void
PrintStatistics(const brick_pool* Bp)
{
  const idx2_file* Idx2 = Bp->Idx2;
  i64 Count[idx2_file::MaxLevels] = {};

  idx2_ForEach (BIt, Bp->BrickTable)
  {
    i8 Level = GetLevelFromBrickKey(*BIt.Key);
    ++Count[Level];
  }
  idx2_For (i8, L, 0, Idx2->NLevels)
  {
    i64 NBricks = Prod<i64>(Idx2->NBricks3[L]);
    f64 Percent = f64(Count[L]) * 100 / f64(NBricks);
    printf("level %d: %lld out of %lld bricks significant (%f percent)\n", L, Count[L], NBricks, Percent);
  }
}